

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

double __thiscall Imath_2_5::Matrix44<double>::minorOf(Matrix44<double> *this,int r,int c)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  double dVar6;
  Matrix33<double> working;
  Matrix33<double> local_48;
  
  bVar2 = r < 1;
  bVar1 = r < 2;
  bVar3 = r < 3;
  bVar4 = c < 1;
  uVar5 = (ulong)(c < 2);
  local_48.x[0][0] = this->x[bVar2][bVar4];
  local_48.x[0][1] = this->x[(ulong)bVar1 + 1][bVar4];
  local_48.x[0][2] = this->x[(ulong)bVar3 + 2][bVar4];
  local_48.x[1][0] = this->x[bVar2][uVar5 + 1];
  local_48.x[1][1] = this->x[(ulong)bVar1 + 1][uVar5 + 1];
  local_48.x[1][2] = this->x[(ulong)bVar3 + 2][uVar5 + 1];
  uVar5 = (ulong)((uint)(c < 3) * 8 + 0x10);
  local_48.x[2][0] = *(double *)((long)this->x[bVar2] + uVar5);
  local_48.x[2][1] = *(double *)((long)this->x[(ulong)bVar1 + 1] + uVar5);
  local_48.x[2][2] = *(double *)((long)this->x[(ulong)bVar3 + 2] + uVar5);
  dVar6 = Matrix33<double>::determinant(&local_48);
  return dVar6;
}

Assistant:

inline T
Matrix44<T>::minorOf (const int r, const int c) const
{
    int r0 = 0 + (r < 1 ? 1 : 0);
    int r1 = 1 + (r < 2 ? 1 : 0);
    int r2 = 2 + (r < 3 ? 1 : 0);
    int c0 = 0 + (c < 1 ? 1 : 0);
    int c1 = 1 + (c < 2 ? 1 : 0);
    int c2 = 2 + (c < 3 ? 1 : 0);

    Matrix33<T> working (x[r0][c0],x[r1][c0],x[r2][c0],
                         x[r0][c1],x[r1][c1],x[r2][c1],
                         x[r0][c2],x[r1][c2],x[r2][c2]);

    return working.determinant();
}